

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.c
# Opt level: O0

char * setGroupList(econf_file *key_file,char *name)

{
  char **ppcVar1;
  char *pcVar2;
  econf_file *local_28;
  char *ret;
  char *name_local;
  econf_file *key_file_local;
  
  local_28 = (econf_file *)getFromGroupList(key_file,name);
  key_file_local = local_28;
  if (local_28 == (econf_file *)0x0) {
    key_file->group_count = key_file->group_count + 1;
    ppcVar1 = (char **)realloc(key_file->groups,(long)(key_file->group_count + 1) << 3);
    key_file->groups = ppcVar1;
    if (key_file->groups == (char **)0x0) {
      key_file->group_count = key_file->group_count + -1;
    }
    else {
      key_file->groups[key_file->group_count] = (char *)0x0;
      pcVar2 = strdup(name);
      key_file->groups[key_file->group_count + -1] = pcVar2;
      local_28 = (econf_file *)key_file->groups[key_file->group_count + -1];
    }
    key_file_local = local_28;
  }
  return (char *)key_file_local;
}

Assistant:

char *setGroupList(econf_file *key_file, const char *name) {
  char *ret = getFromGroupList(key_file, name);
  if (ret != NULL)
    return ret;
  key_file->group_count++;
  key_file->groups =
    realloc(key_file->groups, (key_file->group_count +1) * sizeof(char *));
  if (key_file->groups == NULL) {
    key_file->group_count--;
  } else {
    key_file->groups[key_file->group_count] = NULL;
    key_file->groups[key_file->group_count-1] = strdup(name);
    ret = key_file->groups[key_file->group_count-1];
  }
  return ret;
}